

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void kratos::AssertionRemoval::process_block(StmtBlock *block)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_ptr<kratos::Stmt> *stmt;
  undefined1 auVar4 [8];
  long lVar5;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  
  iVar2 = (*(block->super_Stmt).super_IRNode._vptr_IRNode[1])();
  auStack_48 = (undefined1  [8])0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar4 = auStack_48;
  psVar1 = stmts_to_remove.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (CONCAT44(extraout_var,iVar2) != 0) {
    lVar5 = 0;
    do {
      iVar3 = (*(block->super_Stmt).super_IRNode._vptr_IRNode[2])(block,lVar5);
      if (*(int *)(CONCAT44(extraout_var_00,iVar3) + 0x78) == 10) {
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                  (local_58,(__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                            (CONCAT44(extraout_var_00,iVar3) + 0x68));
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)auStack_48,(shared_ptr<kratos::Stmt> *)local_58);
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
      }
      lVar5 = lVar5 + 1;
      auVar4 = auStack_48;
      psVar1 = stmts_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (CONCAT44(extraout_var,iVar2) != lVar5);
  }
  for (; auVar4 != (undefined1  [8])psVar1; auVar4 = (undefined1  [8])((long)auVar4 + 0x10)) {
    (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,auVar4);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_48);
  return;
}

Assistant:

static void process_block(StmtBlock *block) {
        auto stmt_count = block->child_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto *stmt = reinterpret_cast<Stmt *>(block->get_child(i));
            if (stmt->type() == StatementType::Assert)
                stmts_to_remove.emplace_back(stmt->shared_from_this());
        }
        for (auto const &stmt : stmts_to_remove) {
            block->remove_stmt(stmt);
        }
    }